

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

LiteralString * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::u32string,jsonnet::internal::LiteralString::TokenKind,std::__cxx11::string&,std::__cxx11::string&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                  *args_2,TokenKind *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  LiteralString *this_00;
  LiteralString *in_RCX;
  string *in_RSI;
  LocationRange *in_R8;
  Fodder *in_R9;
  LiteralString *r;
  string *in_stack_ffffffffffffffb8;
  TokenKind in_stack_ffffffffffffffc4;
  UString *in_stack_ffffffffffffffc8;
  
  this_00 = (LiteralString *)operator_new(0xe8);
  LiteralString::LiteralString
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
             in_stack_ffffffffffffffb8,in_RSI);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)this_00,
             (value_type *)this_00);
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }